

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_9.c
# Opt level: O0

int * aom_fast9_score(byte *i,int stride,xy *corners,int num_corners,int b)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int pixel [16];
  int n;
  int *scores;
  int aiStack_78 [17];
  int local_34;
  int *local_30;
  int local_28;
  int local_24;
  long local_20;
  int local_14;
  long local_10;
  int *local_8;
  
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_30 = (int *)malloc((long)in_ECX << 2);
  if (local_30 == (int *)0x0) {
    local_8 = (int *)0x0;
  }
  else {
    make_offsets(aiStack_78,local_14);
    for (local_34 = 0; local_34 < local_24; local_34 = local_34 + 1) {
      iVar1 = fast9_corner_score((byte *)(local_10 +
                                          *(int *)(local_20 + 4 + (long)local_34 * 8) * local_14 +
                                         (long)*(int *)(local_20 + (long)local_34 * 8)),aiStack_78,
                                 local_28);
      local_30[local_34] = iVar1;
    }
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

int* aom_fast9_score(const byte* i, int stride, const xy* corners, int num_corners, int b)
{
  int* scores = (int*)malloc(sizeof(int)* num_corners);
  int n;

  int pixel[16];
  if(!scores) return NULL;
  make_offsets(pixel, stride);

  for(n=0; n < num_corners; n++)
    scores[n] = fast9_corner_score(i + corners[n].y*stride + corners[n].x, pixel, b);

  return scores;
}